

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

bool __thiscall
spvtools::val::ValidationState_t::RegisterUniqueTypeDeclaration
          (ValidationState_t *this,Instruction *inst)

{
  spv_parsed_operand_t *psVar1;
  int iVar2;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *this_00;
  spv_parsed_operand_t *psVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  size_type sVar5;
  pair<std::_Rb_tree_const_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_bool>
  pVar6;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_80;
  uint *local_78;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_70;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_68;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_60;
  const_iterator local_58;
  int local_50;
  uint local_4c;
  int words_end;
  int words_begin;
  spv_parsed_operand_t *operand;
  size_t index;
  undefined1 local_30 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> key;
  Instruction *inst_local;
  ValidationState_t *this_local;
  
  key.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)inst;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
  index._4_4_ = val::Instruction::opcode
                          ((Instruction *)
                           key.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,
             (value_type *)((long)&index + 4));
  operand = (spv_parsed_operand_t *)0x0;
  do {
    psVar1 = operand;
    this_00 = val::Instruction::operands
                        ((Instruction *)
                         key.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage);
    psVar3 = (spv_parsed_operand_t *)
             std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size(this_00)
    ;
    if (psVar3 <= psVar1) {
      pVar6 = std::
              set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::insert(&this->unique_type_declarations_,(value_type *)local_30);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
      return (bool)(pVar6.second & 1);
    }
    _words_end = val::Instruction::operand
                           ((Instruction *)
                            key.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(size_t)operand);
    if (_words_end->type != SPV_OPERAND_TYPE_RESULT_ID) {
      local_4c = (uint)_words_end->offset;
      iVar2 = local_4c + _words_end->num_words;
      local_50 = iVar2;
      pvVar4 = val::Instruction::words
                         ((Instruction *)
                          key.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar4);
      if ((int)sVar5 < iVar2) {
        __assert_fail("words_end <= static_cast<int>(inst->words().size())",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validation_state.cpp"
                      ,0x34e,
                      "bool spvtools::val::ValidationState_t::RegisterUniqueTypeDeclaration(const Instruction *)"
                     );
      }
      local_60._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
      __gnu_cxx::
      __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
      ::__normal_iterator<unsigned_int*>
                ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  *)&local_58,&local_60);
      pvVar4 = val::Instruction::words
                         ((Instruction *)
                          key.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      local_70._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar4);
      local_68 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator+(&local_70,(long)(int)local_4c);
      pvVar4 = val::Instruction::words
                         ((Instruction *)
                          key.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      local_80._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar4);
      local_78 = (uint *)__gnu_cxx::
                         __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                         ::operator+(&local_80,(long)local_50);
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_30,local_58,local_68,
                 (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )local_78);
    }
    operand = (spv_parsed_operand_t *)((long)&operand->offset + 1);
  } while( true );
}

Assistant:

bool ValidationState_t::RegisterUniqueTypeDeclaration(const Instruction* inst) {
  std::vector<uint32_t> key;
  key.push_back(static_cast<uint32_t>(inst->opcode()));
  for (size_t index = 0; index < inst->operands().size(); ++index) {
    const spv_parsed_operand_t& operand = inst->operand(index);

    if (operand.type == SPV_OPERAND_TYPE_RESULT_ID) continue;

    const int words_begin = operand.offset;
    const int words_end = words_begin + operand.num_words;
    assert(words_end <= static_cast<int>(inst->words().size()));

    key.insert(key.end(), inst->words().begin() + words_begin,
               inst->words().begin() + words_end);
  }

  return unique_type_declarations_.insert(std::move(key)).second;
}